

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_wsi_mux_close_children(lws *wsi,int reason)

{
  lws *plVar1;
  lws **pplVar2;
  lws **w;
  lws *wsi2;
  int reason_local;
  lws *wsi_local;
  
  if ((wsi->mux).child_list != (lws *)0x0) {
    pplVar2 = &(wsi->mux).child_list;
    while (*pplVar2 != (lws *)0x0) {
      _lws_log(8,"   closing child %p\n",*pplVar2);
      plVar1 = ((*pplVar2)->mux).sibling_list;
      if (plVar1 == *pplVar2) {
        __assert_fail("wsi2 != *w",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi.c"
                      ,0x461,"void lws_wsi_mux_close_children(struct lws *, int)");
      }
      ((*pplVar2)->mux).sibling_list = (lws *)0x0;
      *(ulong *)&(*pplVar2)->field_0x2dc =
           *(ulong *)&(*pplVar2)->field_0x2dc & 0xffffffffffffefff | 0x1000;
      __lws_close_free_wsi(*pplVar2,reason,"mux child recurse");
      *pplVar2 = plVar1;
    }
  }
  return;
}

Assistant:

void
lws_wsi_mux_close_children(struct lws *wsi, int reason)
{
	struct lws *wsi2;

	if (!wsi->mux.child_list)
		return;

	lws_start_foreach_llp(struct lws **, w, wsi->mux.child_list) {
		lwsl_info("   closing child %p\n", *w);
		/* disconnect from siblings */
		wsi2 = (*w)->mux.sibling_list;
		assert (wsi2 != *w);
		(*w)->mux.sibling_list = NULL;
		(*w)->socket_is_permanently_unusable = 1;
		__lws_close_free_wsi(*w, reason, "mux child recurse");
		*w = wsi2;
		continue;
	} lws_end_foreach_llp(w, mux.sibling_list);
}